

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_133::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_133 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  iterator ppcVar1;
  uint index;
  iterator ppcVar2;
  ArrayPtr<const_char> local_f0;
  Type *local_e0;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  undefined1 in_stack_ffffffffffffff50 [16];
  Fault f;
  bool local_70;
  BuilderFor<capnp::DynamicList> list;
  
  ppcVar1 = expected._M_array;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,(Builder *)this);
  _kjCondition.right = list.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (iterator)(ulong)list.builder.elementCount == ppcVar1;
  _kjCondition.left = (unsigned_long)ppcVar1;
  if (_kjCondition.result) {
    if (ppcVar1 != (iterator)0x0) {
      ppcVar2 = (iterator)0x0;
      do {
        index = (uint)ppcVar2;
        local_e0 = &reader->type + (long)ppcVar2 * 2;
        DynamicList::Builder::operator[]((Builder *)&_kjCondition,&list,index);
        DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                  ((Builder *)&_kjCondition);
        local_f0 = (ArrayPtr<const_char>)name((DynamicEnum)in_stack_ffffffffffffff50);
        kj::_::DebugExpression<char_const*const&>::operator==
                  ((DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)&f,
                   (DebugExpression<char_const*const&> *)&local_e0,(Reader *)&local_f0);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
        if ((local_70 == false) && (kj::_::Debug::minSeverity < 3)) {
          DynamicList::Builder::operator[]((Builder *)&_kjCondition,&list,index);
          DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                    ((Builder *)&_kjCondition);
          local_f0 = (ArrayPtr<const_char>)name((DynamicEnum)in_stack_ffffffffffffff50);
          kj::_::Debug::
          log<char_const(&)[85],kj::_::DebugComparison<char_const*const&,capnp::Text::Reader>&,char_const*const&,capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x152,ERROR,
                     "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", _kjCondition, expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                     ,(char (*) [85])
                      "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                     ,(DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)&f,
                     (char **)(&reader->type + (long)ppcVar2 * 2),(Reader *)&local_f0);
          DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
        }
        ppcVar2 = (iterator)(ulong)(index + 1);
      } while (ppcVar2 < ppcVar1);
    }
    return;
  }
  local_f0.ptr = (char *)ppcVar1;
  local_e0 = (Type *)CONCAT44(local_e0._4_4_,list.builder.elementCount);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x150,FAILED,"(expected.size()) == (list.size())",
             "_kjCondition,expected.size(), list.size()",&_kjCondition,(unsigned_long *)&local_f0,
             (uint *)&local_e0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}